

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittests.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3b55d::BadVulkanAllocExceptionTest_NoDeviceMemory_Test::TestBody
          (BadVulkanAllocExceptionTest_NoDeviceMemory_Test *this)

{
  bad_vulkan_alloc *this_00;
  AssertionResult gtest_ar;
  
  this_00 = (bad_vulkan_alloc *)__cxa_allocate_exception(0x1b0);
  bad_vulkan_alloc::bad_vulkan_alloc(this_00,-2,"no device memory test");
  __cxa_throw(this_00,&bad_vulkan_alloc::typeinfo,bad_vulkan_alloc::~bad_vulkan_alloc);
}

Assistant:

TEST(BadVulkanAllocExceptionTest, NoDeviceMemory) {
    try {
        throw bad_vulkan_alloc(OUT_OF_DEVICE_MEMORY, "no device memory test");
    } catch (bad_vulkan_alloc& e) {
        EXPECT_EQ(strcmp(e.what(), "Out of device memory for no device memory test."), 0);
    }
}